

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O1

void __thiscall write_node_v8::operator()(write_node_v8 *this,ai_node *node,xr_writer *w)

{
  uint16_t local_1a;
  uint16_t local_18;
  uint16_t local_16;
  uint32_t local_14;
  
  (*w->_vptr_xr_writer[2])(w,node,0xc);
  local_1a = node->cover;
  (*w->_vptr_xr_writer[2])(w,&local_1a,2);
  local_18 = node->plane;
  (*w->_vptr_xr_writer[2])(w,&local_18,2);
  local_14 = node->packed_xz;
  (*w->_vptr_xr_writer[2])(w,&local_14,3);
  local_16 = node->packed_y;
  (*w->_vptr_xr_writer[2])(w,&local_16,2);
  return;
}

Assistant:

void operator()(const ai_node& node, xr_writer& w) const {
	w.w_cseq(12, node.data);
	w.w_u16(node.cover);
	w.w_u16(node.plane);
	w.w_u24(node.packed_xz);
	w.w_u16(node.packed_y);
}